

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setFederateOperator
          (CommonCore *this,LocalFederateId federateID,
          shared_ptr<helics::FederateOperator> *callbacks)

{
  uint16_t uVar1;
  int iVar2;
  FederateState *pFVar3;
  InvalidIdentifier *this_00;
  string_view message;
  ActionMessage fedOpUpdate;
  
  if (setFederateOperator(helics::LocalFederateId,std::shared_ptr<helics::FederateOperator>)::
      nullFederate == '\0') {
    iVar2 = __cxa_guard_acquire(&setFederateOperator(helics::LocalFederateId,std::shared_ptr<helics::FederateOperator>)
                                 ::nullFederate);
    if (iVar2 != 0) {
      std::make_shared<helics::NullFederateOperator>();
      setFederateOperator::nullFederate.
      super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           fedOpUpdate.messageID;
      setFederateOperator::nullFederate.
      super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           fedOpUpdate.messageAction;
      setFederateOperator::nullFederate.
      super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = fedOpUpdate.source_id.gid;
      setFederateOperator::nullFederate.
      super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = fedOpUpdate.source_handle.hid;
      fedOpUpdate.messageAction = cmd_ignore;
      fedOpUpdate.messageID = 0;
      fedOpUpdate.source_id.gid = 0;
      fedOpUpdate.source_handle.hid = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fedOpUpdate.source_id);
      __cxa_atexit(std::__shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&setFederateOperator::nullFederate,&__dso_handle);
      __cxa_guard_release(&setFederateOperator(helics::LocalFederateId,std::shared_ptr<helics::FederateOperator>)
                           ::nullFederate);
    }
  }
  pFVar3 = getFederateAt(this,federateID);
  if (pFVar3 != (FederateState *)0x0) {
    ActionMessage::ActionMessage(&fedOpUpdate,cmd_core_configure);
    fedOpUpdate.messageID = 0x240;
    if ((callbacks->super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
        == (element_type *)0x0) {
      std::__shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&callbacks->
                  super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>,
                 &setFederateOperator::nullFederate.
                  super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>);
    }
    uVar1 = getNextAirlockIndex(this);
    gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
    load<std::shared_ptr<helics::FederateOperator>>
              ((AirLock<std::any,std::mutex,std::condition_variable> *)
               ((this->dataAirlocks)._M_elems + uVar1),callbacks);
    fedOpUpdate.source_id.gid = (pFVar3->global_id)._M_i.gid;
    fedOpUpdate.counter = uVar1;
    gmlc::containers::
    BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
    push<helics::ActionMessage&>
              ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
               &(this->super_BrokerBase).actionQueue,&fedOpUpdate);
    ActionMessage::~ActionMessage(&fedOpUpdate);
    return;
  }
  this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
  message._M_str = "FederateID is not valid (setFederateOperator)";
  message._M_len = 0x2d;
  InvalidIdentifier::InvalidIdentifier(this_00,message);
  __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setFederateOperator(LocalFederateId federateID,
                                     std::shared_ptr<FederateOperator> callbacks)
{
    static const std::shared_ptr<FederateOperator> nullFederate =
        std::make_shared<NullFederateOperator>();

    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("FederateID is not valid (setFederateOperator)"));
    }

    ActionMessage fedOpUpdate(CMD_CORE_CONFIGURE);
    fedOpUpdate.messageID = UPDATE_FEDERATE_OPERATOR;
    if (!callbacks) {
        callbacks = nullFederate;
    }
    auto index = getNextAirlockIndex();
    dataAirlocks[index].load(std::move(callbacks));
    fedOpUpdate.counter = index;
    fedOpUpdate.source_id = fed->global_id.load();
    actionQueue.push(fedOpUpdate);
}